

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O2

void __thiscall
remora::matrix<double,remora::column_major,remora::cpu_tag>::
matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
          (matrix<double,remora::column_major,remora::cpu_tag> *this,
          matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
          *e)

{
  long lVar1;
  long lVar2;
  allocator_type local_19;
  
  lVar1 = *(long *)e;
  *(long *)this = lVar1;
  lVar2 = *(long *)(e + 8);
  *(long *)(this + 8) = lVar2;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)(this + 0x10),lVar2 * lVar1,&local_19);
  kernels::
  assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
            ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
              *)this,e);
  return;
}

Assistant:

matrix(matrix_expression<E, cpu_tag> const& e)
	: m_size1(e().size1())
	, m_size2(e().size2())
	, m_data(m_size1 * m_size2) {
		assign(*this,e);
	}